

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTable.c
# Opt level: O0

Aig_Obj_t * Aig_TableLookupTwo(Aig_Man_t *p,Aig_Obj_t *pFanin0,Aig_Obj_t *pFanin1)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pAVar2;
  undefined8 local_68;
  undefined8 local_50;
  Aig_Obj_t *pGhost;
  Aig_Obj_t *pFanin1_local;
  Aig_Obj_t *pFanin0_local;
  Aig_Man_t *p_local;
  
  p_local = (Aig_Man_t *)pFanin0;
  if (pFanin0 != pFanin1) {
    pAVar1 = Aig_Not(pFanin1);
    if (pFanin0 == pAVar1) {
      p_local = (Aig_Man_t *)Aig_ManConst0(p);
    }
    else {
      pAVar1 = Aig_Regular(pFanin0);
      pAVar2 = Aig_ManConst1(p);
      if (pAVar1 == pAVar2) {
        pAVar1 = Aig_ManConst1(p);
        local_50 = (Aig_Man_t *)pFanin1;
        if (pFanin0 != pAVar1) {
          local_50 = (Aig_Man_t *)Aig_ManConst0(p);
        }
        p_local = local_50;
      }
      else {
        pAVar1 = Aig_Regular(pFanin1);
        pAVar2 = Aig_ManConst1(p);
        if (pAVar1 == pAVar2) {
          pAVar1 = Aig_ManConst1(p);
          local_68 = (Aig_Man_t *)pFanin0;
          if (pFanin1 != pAVar1) {
            local_68 = (Aig_Man_t *)Aig_ManConst0(p);
          }
          p_local = local_68;
        }
        else {
          pAVar1 = Aig_ObjCreateGhost(p,pFanin0,pFanin1,AIG_OBJ_AND);
          p_local = (Aig_Man_t *)Aig_TableLookup(p,pAVar1);
        }
      }
    }
  }
  return (Aig_Obj_t *)p_local;
}

Assistant:

Aig_Obj_t * Aig_TableLookupTwo( Aig_Man_t * p, Aig_Obj_t * pFanin0, Aig_Obj_t * pFanin1 )
{
    Aig_Obj_t * pGhost;
    // consider simple cases
    if ( pFanin0 == pFanin1 )
        return pFanin0;
    if ( pFanin0 == Aig_Not(pFanin1) )
        return Aig_ManConst0(p);
    if ( Aig_Regular(pFanin0) == Aig_ManConst1(p) )
        return pFanin0 == Aig_ManConst1(p) ? pFanin1 : Aig_ManConst0(p);
    if ( Aig_Regular(pFanin1) == Aig_ManConst1(p) )
        return pFanin1 == Aig_ManConst1(p) ? pFanin0 : Aig_ManConst0(p);
    pGhost = Aig_ObjCreateGhost( p, pFanin0, pFanin1, AIG_OBJ_AND );
    return Aig_TableLookup( p, pGhost );
}